

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  ImGuiStoragePair *it_00;
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *pIVar2;
  ImGuiStoragePair local_38;
  ImGuiStoragePair *local_28;
  ImGuiStoragePair *it;
  void *default_val_local;
  ImGuiStorage *pIStack_10;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  it = (ImGuiStoragePair *)default_val;
  default_val_local._4_4_ = key;
  pIStack_10 = this;
  pIVar1 = LowerBound(&this->Data,key);
  local_28 = pIVar1;
  pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::end(&this->Data);
  it_00 = local_28;
  if ((pIVar1 == pIVar2) || (local_28->key != default_val_local._4_4_)) {
    ImGuiStoragePair::ImGuiStoragePair(&local_38,default_val_local._4_4_,it);
    local_28 = ImVector<ImGuiStorage::ImGuiStoragePair>::insert(&this->Data,it_00,&local_38);
  }
  return (void **)&local_28->field_1;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_p;
}